

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<kj::_::DebugComparison<kj::StringPtr,kj::StringPtr>&>
          (String *__return_storage_ptr__,kj *this,
          DebugComparison<kj::StringPtr,_kj::StringPtr> *params)

{
  ArrayPtr<const_char> *in_R8;
  StringPtr local_48;
  undefined8 local_38;
  long local_30;
  String local_28;
  
  local_38 = *(undefined8 *)this;
  local_30 = *(long *)(this + 8) + -1;
  local_48.content.ptr = *(char **)(this + 0x10);
  local_48.content.size_ = *(long *)(this + 0x18) - 1;
  _::concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::ArrayPtr<char_const>>
            (&local_28,(_ *)&local_38,(ArrayPtr<const_char> *)(this + 0x20),&local_48,in_R8);
  (__return_storage_ptr__->content).ptr = local_28.content.ptr;
  (__return_storage_ptr__->content).size_ = local_28.content.size_;
  (__return_storage_ptr__->content).disposer = local_28.content.disposer;
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}